

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O2

void parser_suite::parse_integer(void)

{
  bool bVar1;
  uchar (*in_RDX) [1];
  uchar (*input_00) [1];
  uchar (*input_01) [2];
  uchar (*input_02) [3];
  uchar (*input_03) [5];
  uchar (*input_04) [9];
  value_type input [1];
  undefined3 uStack_5f;
  ushort uStack_5e;
  type_conflict4 local_5c;
  value_type input_4 [5];
  basic_variable<std::allocator<char>_> result;
  
  input[0] = '\x02';
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            (&result,(bintoken *)input,in_RDX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>(&result);
  boost::detail::test_impl
            ("result.is<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x3e,"void parser_suite::parse_integer()",bVar1);
  input_4._0_4_ = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&result);
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x3f,"void parser_suite::parse_integer()",input_4,&local_5c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  _input = CONCAT31(uStack_5f,0xfe);
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            (&result,(bintoken *)input,input_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>(&result);
  boost::detail::test_impl
            ("result.is<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x45,"void parser_suite::parse_integer()",bVar1);
  input_4._0_4_ = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&result);
  local_5c = -2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","-2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x46,"void parser_suite::parse_integer()",input_4,&local_5c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  _input = 0x2a0;
  trial::protocol::bintoken::parse<unsigned_char[2],std::allocator<char>>
            (&result,(bintoken *)input,input_01);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<signed_char>(&result);
  boost::detail::test_impl
            ("result.is<std::int8_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x4c,"void parser_suite::parse_integer()",bVar1);
  input_4._0_4_ = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&result);
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x4d,"void parser_suite::parse_integer()",input_4,&local_5c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  uStack_5e = uStack_5e & 0xff00;
  _input = CONCAT22(uStack_5e,0x2b2);
  trial::protocol::bintoken::parse<unsigned_char[3],std::allocator<char>>
            (&result,(bintoken *)input,input_02);
  boost::detail::test_impl
            ("result.same<std::int16_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x53,"void parser_suite::parse_integer()",result.storage.current == '\x04');
  input_4._0_4_ = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&result);
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x54,"void parser_suite::parse_integer()",input_4,&local_5c);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  stack0xffffffffffffffac = stack0xffffffffffffffac & 0xffffff00;
  _input_4 = CONCAT44(stack0xffffffffffffffac,0x2c4);
  trial::protocol::bintoken::parse<unsigned_char[5],std::allocator<char>>
            (&result,(bintoken *)input_4,input_03);
  boost::detail::test_impl
            ("result.same<std::int32_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x5a,"void parser_suite::parse_integer()",result.storage.current == '\x06');
  local_5c = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&result);
  _input = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x5b,"void parser_suite::parse_integer()",&local_5c,(bintoken *)input);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  _input_4 = 0x2d6;
  trial::protocol::bintoken::parse<unsigned_char[9],std::allocator<char>>
            (&result,(bintoken *)input_4,input_04);
  boost::detail::test_impl
            ("result.same<std::int64_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x61,"void parser_suite::parse_integer()",result.storage.current == '\b');
  local_5c = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>(&result);
  _input = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x62,"void parser_suite::parse_integer()",&local_5c,(bintoken *)input);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&result.storage);
  return;
}

Assistant:

void parse_integer()
{
    // small-pos-int
    {
        const value_type input[] = { 0x02 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<int>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // small-neg-int
    {
        const value_type input[] = { 0xFE };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<int>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), -2);
    }
    // int8
    {
        const value_type input[] = { bintoken::token::code::int8, 0x02 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<std::int8_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // int16
    {
        const value_type input[] = { bintoken::token::code::int16, 0x02, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<std::int16_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // int32
    {
        const value_type input[] = { bintoken::token::code::int32, 0x02, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<std::int32_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // int64
    {
        const value_type input[] = { bintoken::token::code::int64, 0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<std::int64_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
}